

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_339b0::CtfSeeker::draw(CtfSeeker *this)

{
  int iVar1;
  _Setprecision _Var2;
  _Setiosflags w;
  ostream *poVar3;
  Color *color;
  Vec3 *location;
  long *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Dc;
  Vec3 VVar7;
  Vec3 screenLocation;
  float h;
  ostringstream status;
  ostringstream annote;
  Vec3 textOrigin;
  string seekerStateString;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  Vec3 *in_stack_fffffffffffffb98;
  Vec3 *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  char *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbf0;
  Vec3 local_390;
  float local_384;
  ostringstream local_380 [376];
  fmtflags local_208;
  int local_204;
  ostringstream local_200 [376];
  undefined8 local_88;
  float local_80;
  Vec3 local_74;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  float local_40;
  allocator<char> local_29;
  string local_28 [40];
  
  CtfBase::draw((CtfBase *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::allocator<char>::~allocator(&local_29);
  iVar1 = (int)in_RDI[0x1f];
  if (iVar1 == 0) {
    if ((*(byte *)((long)in_RDI + 0xf4) & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0xfc) & 1) == 0) {
        std::__cxx11::string::operator=(local_28,"seek goal");
      }
      else {
        std::__cxx11::string::operator=(local_28,"seek and evade");
      }
    }
    else {
      std::__cxx11::string::operator=(local_28,"avoid obstacle");
    }
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=(local_28,"tagged");
  }
  else if (iVar1 == 2) {
    std::__cxx11::string::operator=(local_28,"reached goal");
  }
  local_68 = (**(code **)(*in_RDI + 0x40))();
  local_58 = local_68;
  OpenSteer::Vec3::Vec3(&local_74,0.0,0.25,0.0);
  VVar7 = OpenSteer::Vec3::operator+(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_80 = VVar7.z;
  local_88 = VVar7._0_8_;
  VVar7.z = extraout_XMM0_Dc;
  VVar7.x = (float)(int)local_88;
  VVar7.y = (float)(int)((ulong)local_88 >> 0x20);
  local_48 = local_88;
  local_40 = local_80;
  std::__cxx11::ostringstream::ostringstream(local_200);
  poVar3 = std::operator<<((ostream *)local_200,local_28);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setprecision(2);
  local_204 = _Var2._M_n;
  color = (Color *)std::operator<<((ostream *)local_200,_Var2);
  w = std::setiosflags(_S_fixed);
  local_208 = w._M_mask;
  poVar3 = std::operator<<((ostream *)color,w);
  fVar4 = (float)(**(code **)(*in_RDI + 0xd8))();
  location = (Vec3 *)std::ostream::operator<<(poVar3,fVar4);
  std::ostream::operator<<(location,std::ends<char,std::char_traits<char>>);
  fVar5 = OpenSteer::drawGetWindowWidth();
  fVar6 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dTextAt3dLocation
            ((ostringstream *)CONCAT44(fVar4,in_stack_fffffffffffffbd0),location,
             (Color *)CONCAT44(fVar5,fVar6),(float)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
             (float)in_stack_fffffffffffffbb8);
  std::__cxx11::ostringstream::ostringstream(local_380);
  poVar3 = std::operator<<((ostream *)local_380,local_28);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)
           std::ostream::operator<<(local_380,(anonymous_namespace)::CtfBase::obstacleCount);
  poVar3 = std::operator<<(poVar3," obstacles [F1/F2]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<(local_380,(anonymous_namespace)::resetCount);
  poVar3 = std::operator<<(poVar3," restarts");
  std::ostream::operator<<(poVar3,std::ends<char,std::char_traits<char>>);
  local_384 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Vec3::Vec3(&local_390,10.0,local_384 + -50.0,0.0);
  OpenSteer::drawGetWindowWidth();
  OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dTextAt2dLocation
            ((ostringstream *)CONCAT44(_Var2._M_n,in_stack_fffffffffffffbf0),VVar7,color,
             (float)w._M_mask,in_stack_fffffffffffffbe0);
  std::__cxx11::ostringstream::~ostringstream(local_380);
  std::__cxx11::ostringstream::~ostringstream(local_200);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void CtfSeeker::draw (void)
    {
        // first call the draw method in the base class
        CtfBase::draw();

        // select string describing current seeker state
        std::string seekerStateString("");
        switch (state)
        {
        case running:
            if (avoiding)
                seekerStateString = "avoid obstacle";
            else if (evading)
                seekerStateString = "seek and evade";
            else
                seekerStateString = "seek goal";
            break;
        case tagged: seekerStateString = "tagged"; break;
        case atGoal: seekerStateString = "reached goal"; break;
        }

        // annote seeker with its state as text
        const Vec3 textOrigin = position() + Vec3 (0, 0.25, 0);
        std::ostringstream annote;
        annote << seekerStateString << std::endl;
        annote << std::setprecision(2) << std::setiosflags(std::ios::fixed)
               << speed() << std::ends;
        draw2dTextAt3dLocation (annote, textOrigin, gWhite, drawGetWindowWidth(), drawGetWindowHeight());

        // display status in the upper left corner of the window
        std::ostringstream status;
        status << seekerStateString << std::endl;
        status << obstacleCount << " obstacles [F1/F2]" << std::endl;
        status << resetCount << " restarts" << std::ends;
        const float h = drawGetWindowHeight ();
        const Vec3 screenLocation (10, h-50, 0);
        draw2dTextAt2dLocation (status, screenLocation, gGray80, drawGetWindowWidth(), drawGetWindowHeight());
    }